

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colMap.c
# Opt level: O0

int Col_MapSet(Col_Word map,Col_Word key,Col_Word value)

{
  int iVar1;
  uint local_44;
  uint local_40;
  uint local_3c;
  Col_CustomMapType *type;
  Col_MapSetProc *proc;
  Col_Word value_local;
  Col_Word key_local;
  Col_Word map_local;
  
  if (map == 0) {
    local_3c = 0;
  }
  else {
    if ((map & 0xf) == 0) {
      if ((*(byte *)map & 2) == 0) {
        local_44 = 0xffffffff;
      }
      else {
        local_44 = *(byte *)map & 0xfffffffe;
      }
      local_40 = local_44;
    }
    else {
      local_40 = immediateWordTypes[map & 0x1f];
    }
    local_3c = local_40;
  }
  if (local_3c == 0xffffffff) {
    iVar1 = *(int *)(*(ulong *)map & 0xfffffffffffffffe);
    if (iVar1 == 0x800) {
      type = *(Col_CustomMapType **)((int *)(*(ulong *)map & 0xfffffffffffffffe) + 0xe);
    }
    else if (iVar1 == 0x2000) {
      type = (Col_CustomMapType *)Col_HashMapSet;
    }
    else if (iVar1 == 0x4000) {
      type = (Col_CustomMapType *)Col_TrieMapSet;
    }
  }
  else if (local_3c == 0x2a) {
    type = (Col_CustomMapType *)Col_HashMapSet;
  }
  else {
    if (local_3c != 0x42) {
      return 0;
    }
    type = (Col_CustomMapType *)Col_TrieMapSet;
  }
  iVar1 = (*(code *)type)(map,key,value);
  return iVar1;
}

Assistant:

int
Col_MapSet(
    Col_Word map,   /*!< Map to insert entry into. */
    Col_Word key,   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
    Col_Word value) /*!< Entry value. */
{
    Col_MapSetProc *proc;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDMAP,map} */
    TYPECHECK_WORDMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRHASHMAP:
        proc = Col_HashMapSet;
        break;

    case WORD_TYPE_STRTRIEMAP:
        proc = Col_TrieMapSet;
        break;

    case WORD_TYPE_CUSTOM: {
        Col_CustomMapType *type = (Col_CustomMapType *) WORD_TYPEINFO(map);
        switch (type->type.type) {
        case COL_HASHMAP: proc = Col_HashMapSet; break;
        case COL_TRIEMAP: proc = Col_TrieMapSet; break;
        case COL_MAP:     proc = type->setProc; break;
        }
        break;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
        return 0;
    }

    return proc(map, key, value);
}